

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__file.cc
# Opt level: O2

void __thiscall xemmai::io::t_file::f_blocking__(t_file *this,bool a_value)

{
  t_queue<128UL> *ptVar1;
  long in_FS_OFFSET;
  wstring_view a_message;
  wstring_view a_message_00;
  bool a_value_local;
  anon_class_16_2_82308ac0 local_28;
  shared_lock<std::shared_mutex> local_18;
  
  local_28.a_value = &a_value_local;
  ptVar1 = (this->super_t_sharable).super_t_owned.v_owner;
  a_value_local = a_value;
  local_28.this = this;
  if (ptVar1 == *(t_queue<128UL> **)(in_FS_OFFSET + -0x68)) {
    f_blocking__::anon_class_16_2_82308ac0::operator()(&local_28);
  }
  else {
    if (ptVar1 != (t_queue<128UL> *)0x0) {
      a_message._M_str = L"owned by another thread.";
      a_message._M_len = 0x18;
      f_throw(a_message);
    }
    t_shared_lock_with_safe_region<std::shared_mutex>::t_shared_lock_with_safe_region
              ((t_shared_lock_with_safe_region<std::shared_mutex> *)&local_18,
               &(this->super_t_sharable).v_mutex);
    if ((this->super_t_sharable).super_t_owned.v_owner != (t_queue<128UL> *)0x0) {
      a_message_00._M_str = L"owned by another thread.";
      a_message_00._M_len = 0x18;
      f_throw(a_message_00);
    }
    f_blocking__::anon_class_16_2_82308ac0::operator()(&local_28);
    std::shared_lock<std::shared_mutex>::~shared_lock(&local_18);
  }
  return;
}

Assistant:

void t_file::f_blocking__(bool a_value)
{
	f_owned_or_shared<t_shared_lock_with_safe_region>([&]
	{
		if (v_fd < 0) f_throw(L"already closed."sv);
		int flags = fcntl(v_fd, F_GETFL);
		if (flags == -1) portable::f_throw_system_error();
		if (a_value)
			flags &= ~O_NONBLOCK;
		else
			flags |= O_NONBLOCK;
		if (fcntl(v_fd, F_SETFL, flags) == -1) portable::f_throw_system_error();
	});
}